

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::AddNotDefinedError
          (DescriptorBuilder *this,string *element_name,Message *descriptor,ErrorLocation location,
          string *undefined_symbol)

{
  undefined1 *puVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  long *plVar3;
  undefined8 *puVar4;
  size_type *psVar5;
  long *plVar6;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((this->possible_undeclared_dependency_ == (FileDescriptor *)0x0) &&
     ((this->undefine_resolved_name_)._M_string_length == 0)) {
    std::operator+(&local_d0,"\"",undefined_symbol);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0.field_2._8_8_ = plVar3[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_f0._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    AddError(this,element_name,descriptor,location,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    pbVar2 = &local_d0;
  }
  else {
    if (this->possible_undeclared_dependency_ != (FileDescriptor *)0x0) {
      std::operator+(&local_50,"\"",&this->possible_undeclared_dependency_name_);
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_b0 = &local_a0;
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_a0 = *plVar6;
        lStack_98 = plVar3[3];
      }
      else {
        local_a0 = *plVar6;
        local_b0 = (long *)*plVar3;
      }
      local_a8 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_b0,
                                  **(ulong **)this->possible_undeclared_dependency_);
      local_90 = &local_80;
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_80 = *plVar6;
        lStack_78 = plVar3[3];
      }
      else {
        local_80 = *plVar6;
        local_90 = (long *)*plVar3;
      }
      local_88 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_90);
      local_70 = &local_60;
      plVar6 = plVar3 + 2;
      if ((long *)*plVar3 == plVar6) {
        local_60 = *plVar6;
        lStack_58 = plVar3[3];
      }
      else {
        local_60 = *plVar6;
        local_70 = (long *)*plVar3;
      }
      local_68 = plVar3[1];
      *plVar3 = (long)plVar6;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_70,(ulong)(this->filename_)._M_dataplus._M_p);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_d0.field_2._M_allocated_capacity = *psVar5;
        local_d0.field_2._8_8_ = plVar3[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar5;
        local_d0._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_d0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      plVar3 = (long *)std::__cxx11::string::append((char *)&local_d0);
      psVar5 = (size_type *)(plVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar5) {
        local_f0.field_2._M_allocated_capacity = *psVar5;
        local_f0.field_2._8_8_ = plVar3[3];
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar5;
        local_f0._M_dataplus._M_p = (pointer)*plVar3;
      }
      local_f0._M_string_length = plVar3[1];
      *plVar3 = (long)psVar5;
      plVar3[1] = 0;
      *(undefined1 *)(plVar3 + 2) = 0;
      AddError(this,element_name,descriptor,location,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70);
      }
      if (local_90 != &local_80) {
        operator_delete(local_90);
      }
      if (local_b0 != &local_a0) {
        operator_delete(local_b0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
    if ((this->undefine_resolved_name_)._M_string_length == 0) {
      return;
    }
    std::operator+(&local_50,"\"",undefined_symbol);
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
    local_b0 = &local_a0;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_a0 = *plVar3;
      lStack_98 = puVar4[3];
    }
    else {
      local_a0 = *plVar3;
      local_b0 = (long *)*puVar4;
    }
    local_a8 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_b0,(ulong)(this->undefine_resolved_name_)._M_dataplus._M_p);
    local_90 = &local_80;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_80 = *plVar3;
      lStack_78 = puVar4[3];
    }
    else {
      local_80 = *plVar3;
      local_90 = (long *)*puVar4;
    }
    local_88 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_90);
    local_70 = &local_60;
    plVar3 = puVar4 + 2;
    if ((long *)*puVar4 == plVar3) {
      local_60 = *plVar3;
      lStack_58 = puVar4[3];
    }
    else {
      local_60 = *plVar3;
      local_70 = (long *)*puVar4;
    }
    local_68 = puVar4[1];
    *puVar4 = plVar3;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append
                       ((char *)&local_70,(ulong)(undefined_symbol->_M_dataplus)._M_p);
    psVar5 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0.field_2._8_8_ = puVar4[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar5;
      local_d0._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_d0._M_string_length = puVar4[1];
    *puVar4 = psVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_d0);
    psVar5 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0.field_2._8_8_ = puVar4[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar5;
      local_f0._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_f0._M_string_length = puVar4[1];
    *puVar4 = psVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    AddError(this,element_name,descriptor,location,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    pbVar2 = &local_50;
  }
  puVar1 = (undefined1 *)(&(pbVar2->field_2)._M_allocated_capacity)[-2];
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar1 != &pbVar2->field_2) {
    operator_delete(puVar1);
  }
  return;
}

Assistant:

void DescriptorBuilder::AddNotDefinedError(
    const std::string& element_name, const Message& descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location,
    const std::string& undefined_symbol) {
  if (possible_undeclared_dependency_ == nullptr &&
      undefine_resolved_name_.empty()) {
    AddError(element_name, descriptor, location,
             "\"" + undefined_symbol + "\" is not defined.");
  } else {
    if (possible_undeclared_dependency_ != nullptr) {
      AddError(element_name, descriptor, location,
               "\"" + possible_undeclared_dependency_name_ +
                   "\" seems to be defined in \"" +
                   possible_undeclared_dependency_->name() +
                   "\", which is not "
                   "imported by \"" +
                   filename_ +
                   "\".  To use it here, please "
                   "add the necessary import.");
    }
    if (!undefine_resolved_name_.empty()) {
      AddError(element_name, descriptor, location,
               "\"" + undefined_symbol + "\" is resolved to \"" +
                   undefine_resolved_name_ +
                   "\", which is not defined. "
                   "The innermost scope is searched first in name resolution. "
                   "Consider using a leading '.'(i.e., \"." +
                   undefined_symbol + "\") to start from the outermost scope.");
    }
  }
}